

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryGridRenderTests.cpp
# Opt level: O0

bool vkt::tessellation::anon_unknown_1::verifyResultLayer
               (TestLog *log,ConstPixelBufferAccess *image,int layerNdx)

{
  RGBA RVar1;
  int iVar2;
  int height;
  MessageBuilder *pMVar3;
  TestLog *pTVar4;
  bool bVar5;
  ConstPixelBufferAccess local_920;
  allocator<char> local_8f1;
  string local_8f0;
  allocator<char> local_8c9;
  string local_8c8;
  LogImage local_8a8;
  allocator<char> local_811;
  string local_810;
  allocator<char> local_7e9;
  string local_7e8;
  LogImage local_7c8;
  allocator<char> local_731;
  string local_730;
  allocator<char> local_709;
  string local_708;
  LogImageSet local_6e8;
  MessageBuilder local_6a8;
  undefined4 local_528;
  allocator<char> local_521;
  string local_520;
  allocator<char> local_4f9;
  string local_4f8;
  LogImage local_4d8;
  allocator<char> local_441;
  string local_440;
  allocator<char> local_419;
  string local_418;
  LogImageSet local_3f8;
  MessageBuilder local_3b8;
  deUint32 local_234;
  undefined1 local_230 [24];
  RGBA color;
  int threshold;
  int x;
  int y;
  Vector<float,_4> local_8c;
  PixelBufferAccess local_70;
  byte local_41;
  undefined1 local_40 [7];
  bool foundError;
  Surface errorMask;
  int layerNdx_local;
  ConstPixelBufferAccess *image_local;
  TestLog *log_local;
  
  errorMask.m_pixels.m_cap._4_4_ = layerNdx;
  iVar2 = tcu::ConstPixelBufferAccess::getWidth(image);
  height = tcu::ConstPixelBufferAccess::getHeight(image);
  tcu::Surface::Surface((Surface *)local_40,iVar2,height);
  local_41 = 0;
  tcu::Surface::getAccess(&local_70,(Surface *)local_40);
  tcu::Vector<float,_4>::Vector(&local_8c,0.0,1.0,0.0,1.0);
  tcu::clear(&local_70,&local_8c);
  tcu::TestLog::operator<<((MessageBuilder *)&x,log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&x,(char (*) [24])"Verifying output layer ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(int *)((long)&errorMask.m_pixels.m_cap + 4));
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&x);
  threshold = 0;
  do {
    iVar2 = tcu::ConstPixelBufferAccess::getHeight(image);
    if (iVar2 <= threshold) {
      bVar5 = (local_41 & 1) != 0;
      if (bVar5) {
        tcu::TestLog::operator<<(&local_6a8,log,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar3 = tcu::MessageBuilder::operator<<
                           (&local_6a8,
                            (char (*) [49])"Image verification failed, found invalid pixels.");
        pTVar4 = tcu::MessageBuilder::operator<<
                           (pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_708,"ImageVerification",&local_709);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_730,"Image verification",&local_731);
        tcu::LogImageSet::LogImageSet(&local_6e8,&local_708,&local_730);
        pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_6e8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_7e8,"Result",&local_7e9)
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_810,"Rendered result",&local_811);
        tcu::LogImage::LogImage
                  (&local_7c8,&local_7e8,&local_810,image,QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_7c8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_8c8,"ErrorMask",&local_8c9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_8f0,"Error mask",&local_8f1);
        tcu::Surface::getAccess((PixelBufferAccess *)&local_920,(Surface *)local_40);
        tcu::LogImage::LogImage
                  (&local_8a8,&local_8c8,&local_8f0,&local_920,QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_8a8);
        tcu::TestLog::operator<<(pTVar4,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
        tcu::LogImage::~LogImage(&local_8a8);
        std::__cxx11::string::~string((string *)&local_8f0);
        std::allocator<char>::~allocator(&local_8f1);
        std::__cxx11::string::~string((string *)&local_8c8);
        std::allocator<char>::~allocator(&local_8c9);
        tcu::LogImage::~LogImage(&local_7c8);
        std::__cxx11::string::~string((string *)&local_810);
        std::allocator<char>::~allocator(&local_811);
        std::__cxx11::string::~string((string *)&local_7e8);
        std::allocator<char>::~allocator(&local_7e9);
        tcu::LogImageSet::~LogImageSet(&local_6e8);
        std::__cxx11::string::~string((string *)&local_730);
        std::allocator<char>::~allocator(&local_731);
        std::__cxx11::string::~string((string *)&local_708);
        std::allocator<char>::~allocator(&local_709);
        tcu::MessageBuilder::~MessageBuilder(&local_6a8);
      }
      else {
        tcu::TestLog::operator<<(&local_3b8,log,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar3 = tcu::MessageBuilder::operator<<(&local_3b8,(char (*) [13])"Image valid.");
        pTVar4 = tcu::MessageBuilder::operator<<
                           (pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_418,"ImageVerification",&local_419);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_440,"Image verification",&local_441);
        tcu::LogImageSet::LogImageSet(&local_3f8,&local_418,&local_440);
        pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_3f8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f8,"Result",&local_4f9)
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_520,"Rendered result",&local_521);
        tcu::LogImage::LogImage
                  (&local_4d8,&local_4f8,&local_520,image,QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_4d8);
        tcu::TestLog::operator<<(pTVar4,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
        tcu::LogImage::~LogImage(&local_4d8);
        std::__cxx11::string::~string((string *)&local_520);
        std::allocator<char>::~allocator(&local_521);
        std::__cxx11::string::~string((string *)&local_4f8);
        std::allocator<char>::~allocator(&local_4f9);
        tcu::LogImageSet::~LogImageSet(&local_3f8);
        std::__cxx11::string::~string((string *)&local_440);
        std::allocator<char>::~allocator(&local_441);
        std::__cxx11::string::~string((string *)&local_418);
        std::allocator<char>::~allocator(&local_419);
        tcu::MessageBuilder::~MessageBuilder(&local_3b8);
      }
      log_local._7_1_ = !bVar5;
      local_528 = 1;
      tcu::Surface::~Surface((Surface *)local_40);
      return log_local._7_1_;
    }
    color.m_value = 0;
    while( true ) {
      RVar1.m_value = color.m_value;
      iVar2 = tcu::ConstPixelBufferAccess::getWidth(image);
      if (iVar2 <= (int)RVar1.m_value) break;
      local_230._20_4_ = 8;
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_230,(int)image,color.m_value,threshold);
      tcu::RGBA::RGBA((RGBA *)(local_230 + 0x10),(Vec4 *)local_230);
      iVar2 = tcu::RGBA::getGreen((RGBA *)(local_230 + 0x10));
      if (iVar2 < 0xf7) {
LAB_00e07136:
        RVar1.m_value = color.m_value;
        local_234 = (deUint32)tcu::RGBA::red();
        tcu::Surface::setPixel((Surface *)local_40,RVar1.m_value,threshold,(RGBA)local_234);
        local_41 = 1;
      }
      else {
        iVar2 = tcu::RGBA::getBlue((RGBA *)(local_230 + 0x10));
        if (8 < iVar2) goto LAB_00e07136;
      }
      color.m_value = color.m_value + 1;
    }
    threshold = threshold + 1;
  } while( true );
}

Assistant:

bool verifyResultLayer (tcu::TestLog& log, const tcu::ConstPixelBufferAccess& image, const int layerNdx)
{
	tcu::Surface errorMask	(image.getWidth(), image.getHeight());
	bool		 foundError	= false;

	tcu::clear(errorMask.getAccess(), tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f));

	log << tcu::TestLog::Message << "Verifying output layer " << layerNdx  << tcu::TestLog::EndMessage;

	for (int y = 0; y < image.getHeight(); ++y)
	for (int x = 0; x < image.getWidth(); ++x)
	{
		const int		threshold	= 8;
		const tcu::RGBA	color		(image.getPixel(x, y));

		// Color must be a linear combination of green and yellow
		if (color.getGreen() < 255 - threshold || color.getBlue() > threshold)
		{
			errorMask.setPixel(x, y, tcu::RGBA::red());
			foundError = true;
		}
	}

	if (!foundError)
	{
		log << tcu::TestLog::Message << "Image valid." << tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("ImageVerification", "Image verification")
			<< tcu::TestLog::Image("Result", "Rendered result", image)
			<< tcu::TestLog::EndImageSet;
		return true;
	}
	else
	{
		log	<< tcu::TestLog::Message << "Image verification failed, found invalid pixels." << tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("ImageVerification", "Image verification")
			<< tcu::TestLog::Image("Result", "Rendered result", image)
			<< tcu::TestLog::Image("ErrorMask", "Error mask", errorMask.getAccess())
			<< tcu::TestLog::EndImageSet;
		return false;
	}
}